

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

SyntaxNode * __thiscall
slang::syntax::DeepCloneVisitor::visit<slang::syntax::ChargeStrengthSyntax>
          (DeepCloneVisitor *this,ChargeStrengthSyntax *node,BumpAllocator *alloc)

{
  ChargeStrengthSyntax *pCVar1;
  Token local_50;
  Token local_40;
  Token local_30;
  
  local_30 = parsing::Token::deepClone(&node->openParen,alloc);
  local_40 = parsing::Token::deepClone(&node->strength,alloc);
  local_50 = parsing::Token::deepClone(&node->closeParen,alloc);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ChargeStrengthSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token>
                     (alloc,&local_30,&local_40,&local_50);
  return (SyntaxNode *)pCVar1;
}

Assistant:

SyntaxNode* visit(const T& node, BumpAllocator& alloc) {
        return deep::clone(node, alloc);
    }